

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageConfigValue(Fts5Storage *p,char *z,sqlite3_value *pVal,int iVal)

{
  Fts5Config *pFVar1;
  sqlite3_stmt *p_00;
  sqlite3_blob *pBlob;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  sqlite3_stmt *pReplace;
  sqlite3_blob *local_48;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pReplace = (sqlite3_stmt *)0x0;
  iVar2 = fts5StorageGetStmt(p,10,&pReplace,(char **)0x0);
  p_00 = pReplace;
  if (iVar2 == 0) {
    sqlite3_bind_text(pReplace,1,z,-1,(_func_void_void_ptr *)0x0);
    if (pVal == (sqlite3_value *)0x0) {
      sqlite3_bind_int(p_00,2,iVal);
    }
    else {
      sqlite3_bind_value(p_00,2,pVal);
    }
    sqlite3_step(p_00);
    iVar2 = sqlite3_reset(p_00);
    sqlite3_bind_null(p_00,1);
    if (pVal != (sqlite3_value *)0x0 && iVar2 == 0) {
      pFVar1 = p->pIndex->pConfig;
      local_48 = (sqlite3_blob *)0x0;
      iVar3 = p->pConfig->iCookie + 1;
      local_3c = (undefined1)((uint)iVar3 >> 0x18);
      local_3b = (undefined1)((uint)iVar3 >> 0x10);
      local_3a = (undefined1)((uint)iVar3 >> 8);
      local_39 = (undefined1)iVar3;
      iVar2 = sqlite3_blob_open(pFVar1->db,pFVar1->zDb,p->pIndex->zDataTbl,"block",10,1,&local_48);
      pBlob = local_48;
      if (iVar2 == 0) {
        sqlite3_blob_write(local_48,&local_3c,4,0);
        iVar2 = sqlite3_blob_close(pBlob);
        if (iVar2 == 0) {
          p->pConfig->iCookie = iVar3;
          iVar2 = 0;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5StorageConfigValue(
  Fts5Storage *p,
  const char *z,
  sqlite3_value *pVal,
  int iVal
){
  sqlite3_stmt *pReplace = 0;
  int rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_CONFIG, &pReplace, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_text(pReplace, 1, z, -1, SQLITE_STATIC);
    if( pVal ){
      sqlite3_bind_value(pReplace, 2, pVal);
    }else{
      sqlite3_bind_int(pReplace, 2, iVal);
    }
    sqlite3_step(pReplace);
    rc = sqlite3_reset(pReplace);
    sqlite3_bind_null(pReplace, 1);
  }
  if( rc==SQLITE_OK && pVal ){
    int iNew = p->pConfig->iCookie + 1;
    rc = sqlite3Fts5IndexSetCookie(p->pIndex, iNew);
    if( rc==SQLITE_OK ){
      p->pConfig->iCookie = iNew;
    }
  }
  return rc;
}